

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

RegexMatcher * __thiscall
icu_63::RegexMatcher::reset(RegexMatcher *this,int64_t position,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  int64_t position_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    reset(this);
    if ((position < 0) || (this->fActiveLimit < position)) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      this->fMatchEnd = position;
    }
  }
  return this;
}

Assistant:

RegexMatcher &RegexMatcher::reset(int64_t position, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return *this;
    }
    reset();       // Reset also resets the region to be the entire string.

    if (position < 0 || position > fActiveLimit) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return *this;
    }
    fMatchEnd = position;
    return *this;
}